

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O1

Fraction * __thiscall Fraction::operator-=(Fraction *this,Fraction *b)

{
  uint uVar1;
  uint __n;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar2 = this->denominator_;
  uVar1 = b->denominator_;
  iVar3 = 0;
  if (uVar1 != 0 && uVar2 != 0) {
    __n = -uVar1;
    if (0 < (int)uVar1) {
      __n = uVar1;
    }
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(uVar1,__n);
    iVar3 = (uVar1 / uVar2) * __n;
  }
  iVar4 = (iVar3 / this->denominator_) * this->numerator_;
  this->numerator_ = iVar4;
  this->numerator_ = iVar4 - (iVar3 / b->denominator_) * b->numerator_;
  this->denominator_ = iVar3;
  Normalization(this);
  return this;
}

Assistant:

const Fraction& Fraction::operator-=(const Fraction& b) {
  int current_lcm = std::lcm(denominator_, b.denominator_);
  numerator_ *= current_lcm / denominator_;
  numerator_ -= b.numerator_ * (current_lcm / b.denominator_);
  denominator_ = current_lcm;
  Normalization();
  return *this;
}